

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_distinct_aggregator.cpp
# Opt level: O1

void __thiscall
duckdb::WindowDistinctAggregatorLocalState::Sink
          (WindowDistinctAggregatorLocalState *this,DataChunk *sink_chunk,DataChunk *coll_chunk,
          idx_t input_idx,optional_ptr<duckdb::SelectionVector,_true> filter_sel,idx_t filtered)

{
  optional_ptr<duckdb::LocalSortState,_true> *this_00;
  DataChunk *pDVar1;
  data_ptr_t pdVar2;
  WindowAggregator *pWVar3;
  LocalSortState *this_01;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  DataChunk *this_02;
  reference pvVar6;
  const_reference pvVar7;
  reference other;
  optional_ptr<duckdb::LocalSortState,_true> oVar8;
  idx_t iVar9;
  type global_sort_state;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  size_type __n;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  optional_ptr<duckdb::SelectionVector,_true> local_58;
  idx_t local_50;
  reference local_48;
  DataChunk *local_40;
  DataChunk *local_38;
  
  iVar9 = sink_chunk->count;
  pDVar1 = &this->payload_chunk;
  local_58.ptr = filter_sel.ptr;
  local_50 = filtered;
  local_40 = sink_chunk;
  DataChunk::Reset(pDVar1);
  local_38 = pDVar1;
  local_48 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
  auVar5 = _DAT_01df8070;
  auVar4 = _DAT_01defe80;
  if (iVar9 != 0) {
    pdVar2 = local_48->data;
    uVar12 = iVar9 + 0x1fffffffffffffff;
    uVar10 = uVar12 & 0x1fffffffffffffff;
    auVar13._8_4_ = (int)uVar10;
    auVar13._0_8_ = uVar10;
    auVar13._12_4_ = (int)(uVar10 >> 0x20);
    lVar11 = 0;
    auVar13 = auVar13 ^ _DAT_01defe80;
    do {
      auVar14._8_4_ = (int)lVar11;
      auVar14._0_8_ = lVar11;
      auVar14._12_4_ = (int)((ulong)lVar11 >> 0x20);
      auVar14 = (auVar14 | auVar5) ^ auVar4;
      if ((bool)(~(auVar14._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar14._0_4_ ||
                  auVar13._4_4_ < auVar14._4_4_) & 1)) {
        *(idx_t *)(pdVar2 + lVar11 * 8) = input_idx + lVar11;
      }
      if ((auVar14._12_4_ != auVar13._12_4_ || auVar14._8_4_ <= auVar13._8_4_) &&
          auVar14._12_4_ <= auVar13._12_4_) {
        *(idx_t *)(pdVar2 + lVar11 * 8 + 8) = input_idx + lVar11 + 1;
      }
      lVar11 = lVar11 + 2;
    } while ((uVar10 - ((uint)uVar12 & 1)) + 2 != lVar11);
  }
  pWVar3 = (this->gastate->super_WindowAggregatorGlobalState).aggregator;
  if ((pWVar3->child_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (pWVar3->child_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&(this->sort_chunk).data,__n);
      pvVar7 = vector<unsigned_long,_true>::operator[](&pWVar3->child_idx,__n);
      other = vector<duckdb::Vector,_true>::operator[](&coll_chunk->data,*pvVar7);
      Vector::Reference(pvVar6,other);
      __n = __n + 1;
    } while (__n < (ulong)((long)(pWVar3->child_idx).
                                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)(pWVar3->child_idx).
                                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  pDVar1 = &this->sort_chunk;
  pvVar6 = vector<duckdb::Vector,_true>::back(&pDVar1->data);
  Vector::Reference(pvVar6,local_48);
  this_02 = local_38;
  iVar9 = local_40->count;
  (this->sort_chunk).count = iVar9;
  (this->payload_chunk).count = iVar9;
  if (local_58.ptr != (SelectionVector *)0x0) {
    optional_ptr<duckdb::SelectionVector,_true>::CheckValid(&local_58);
    iVar9 = local_50;
    DataChunk::Slice(pDVar1,local_58.ptr,local_50);
    optional_ptr<duckdb::SelectionVector,_true>::CheckValid(&local_58);
    DataChunk::Slice(this_02,local_58.ptr,iVar9);
  }
  this_00 = &this->local_sort;
  if ((this->local_sort).ptr == (LocalSortState *)0x0) {
    oVar8 = WindowDistinctAggregatorGlobalState::InitializeLocalSort(this->gastate);
    (this->local_sort).ptr = oVar8.ptr;
  }
  optional_ptr<duckdb::LocalSortState,_true>::CheckValid(this_00);
  LocalSortState::SinkChunk((this->local_sort).ptr,pDVar1,this_02);
  optional_ptr<duckdb::LocalSortState,_true>::CheckValid(this_00);
  iVar9 = LocalSortState::SizeInBytes((this->local_sort).ptr);
  if (this->gastate->memory_per_thread < iVar9) {
    optional_ptr<duckdb::LocalSortState,_true>::CheckValid(this_00);
    this_01 = (this->local_sort).ptr;
    global_sort_state =
         unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
         operator*(&this->gastate->global_sort);
    LocalSortState::Sort(this_01,global_sort_state,true);
  }
  return;
}

Assistant:

void WindowDistinctAggregatorLocalState::Sink(DataChunk &sink_chunk, DataChunk &coll_chunk, idx_t input_idx,
                                              optional_ptr<SelectionVector> filter_sel, idx_t filtered) {
	//	3: 	for i ← 0 to in.size do
	//	4: 		sorted[i] ← (in[i], i)
	const auto count = sink_chunk.size();
	payload_chunk.Reset();
	auto &sorted_vec = payload_chunk.data[0];
	auto sorted = FlatVector::GetData<idx_t>(sorted_vec);
	std::iota(sorted, sorted + count, input_idx);

	// Our arguments are being fully materialised,
	// but we also need them as sort keys.
	auto &child_idx = gastate.aggregator.child_idx;
	for (column_t c = 0; c < child_idx.size(); ++c) {
		sort_chunk.data[c].Reference(coll_chunk.data[child_idx[c]]);
	}
	sort_chunk.data.back().Reference(sorted_vec);
	sort_chunk.SetCardinality(sink_chunk);
	payload_chunk.SetCardinality(sort_chunk);

	//	Apply FILTER clause, if any
	if (filter_sel) {
		sort_chunk.Slice(*filter_sel, filtered);
		payload_chunk.Slice(*filter_sel, filtered);
	}

	if (!local_sort) {
		local_sort = gastate.InitializeLocalSort();
	}

	local_sort->SinkChunk(sort_chunk, payload_chunk);

	if (local_sort->SizeInBytes() > gastate.memory_per_thread) {
		local_sort->Sort(*gastate.global_sort, true);
	}
}